

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O0

vtt_block_t * vtt_cue_from_caption_frame(caption_frame_t *frame,vtt_t *vtt)

{
  vtt_block_t *block;
  utf8_char_t *__dest;
  size_t in_RSI;
  double *in_RDI;
  vtt_t *unaff_retaddr;
  utf8_char_t *data;
  vtt_block_t *cue;
  undefined8 in_stack_ffffffffffffffe8;
  
  if ((*(long *)(in_RSI + 0x28) != 0) && (*(double *)(*(long *)(in_RSI + 0x28) + 0x18) <= 0.0)) {
    *(double *)(*(long *)(in_RSI + 0x28) + 0x18) =
         *in_RDI - *(double *)(*(long *)(in_RSI + 0x28) + 0x10);
  }
  block = vtt_block_new(unaff_retaddr,(utf8_char_t *)in_RDI,in_RSI,
                        (VTT_BLOCK_TYPE)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  __dest = vtt_block_data(block);
  caption_frame_to_text((caption_frame_t *)cue,data);
  block->timestamp = *in_RDI;
  strcat(__dest,"\r\n");
  return block;
}

Assistant:

vtt_block_t* vtt_cue_from_caption_frame(caption_frame_t* frame, vtt_t* vtt)
{
    if (vtt->cue_tail && 0 >= vtt->cue_tail->duration) {
        vtt->cue_tail->duration = frame->timestamp - vtt->cue_tail->timestamp;
    }

    // CRLF per row, plus an extra at the end
    vtt_block_t* cue = vtt_block_new(vtt, NULL, 2 + CAPTION_FRAME_TEXT_BYTES, VTT_CUE);
    utf8_char_t* data = vtt_block_data(cue);

    caption_frame_to_text(frame, data);
    cue->timestamp = frame->timestamp;
    // vtt requires an extra new line
    strcat((char*)data, "\r\n");
    return cue;
}